

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

void __thiscall DataContainer::Clear(DataContainer *this)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
  local_20;
  __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
  local_18;
  iterator it;
  DataContainer *this_local;
  
  it._M_current = (IContainedElement **)this;
  local_18._M_current =
       (IContainedElement **)
       std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::begin
                 (&this->file_list_);
  while( true ) {
    local_20._M_current =
         (IContainedElement **)
         std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::end
                   (&this->file_list_);
    bVar1 = __gnu_cxx::operator<(&local_18,&local_20);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
              ::operator*(&local_18);
    if (*ppIVar2 != (IContainedElement *)0x0) {
      (*(*ppIVar2)->_vptr_IContainedElement[1])();
    }
    __gnu_cxx::
    __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::clear(&this->file_list_);
  return;
}

Assistant:

void DataContainer::Clear()
{
   for (std::vector<IContainedElement*>::iterator it = file_list_.begin(); it < file_list_.end(); ++it)
   {
      delete *it;
   }

   file_list_.clear();
}